

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void setupWorld(World *world)

{
  Sampler *sampler;
  ViewPlane *pVVar1;
  int *piVar2;
  pointer pPVar3;
  Lambertian *pLVar4;
  GlossySpecular *pGVar5;
  pointer this;
  pointer pSVar6;
  unique_ptr<pm::Material,_std::default_delete<pm::Material>_> local_f8;
  unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> local_f0;
  unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_> local_e8;
  __single_object blue;
  undefined1 local_d0 [8];
  __single_object sphere3;
  unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> local_c0;
  unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_> local_b8;
  __single_object green;
  undefined1 local_a0 [8];
  __single_object sphere2;
  unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> local_90;
  unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_> local_88;
  __single_object red;
  undefined1 local_70 [8];
  __single_object sphere1;
  unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> local_60 [3];
  unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_> local_48;
  __single_object white;
  Vector3 local_34;
  undefined1 local_28 [8];
  __single_object plane;
  Hammersley *hammersley;
  NRooks *vpSampler;
  World *world_local;
  
  sampler = &pm::World::createSampler<pm::NRooks,unsigned_int_const&>(world,&NumSamples)->
             super_Sampler;
  pVVar1 = pm::World::viewPlane(world);
  pm::ViewPlane::setDimensions(pVVar1,0x500,0x2d0);
  pVVar1 = pm::World::viewPlane(world);
  pm::ViewPlane::setSampler(pVVar1,sampler);
  pVVar1 = pm::World::viewPlane(world);
  piVar2 = pm::ViewPlane::editMaxDepth(pVVar1);
  *piVar2 = 5;
  plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
  super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
  super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl =
       (__uniq_ptr_data<pm::Plane,_std::default_delete<pm::Plane>,_true,_true>)
       pm::World::createSampler<pm::Hammersley,unsigned_int_const&>(world,&NumSamples);
  pm::Vector3::Vector3(&local_34,0.0,0.0,0.0);
  pm::Vector3::Vector3((Vector3 *)&white,0.0,1.0,0.0);
  std::make_unique<pm::Plane,pm::Vector3,pm::Vector3>((Vector3 *)local_28,&local_34);
  std::make_unique<pm::Phong>();
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_48);
  pm::Phong::setCd(pPVar3,1.0,1.0,1.0);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_48);
  pm::Phong::setKa(pPVar3,0.25);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_48);
  pm::Phong::setKd(pPVar3,0.45);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_48);
  pLVar4 = pm::Phong::ambient(pPVar3);
  pm::BRDF::setSampler
            (&pLVar4->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_48);
  pLVar4 = pm::Phong::diffuse(pPVar3);
  pm::BRDF::setSampler
            (&pLVar4->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_48);
  pGVar5 = pm::Phong::specular(pPVar3);
  pm::BRDF::setSampler
            (&pGVar5->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  this = std::unique_ptr<pm::Plane,_std::default_delete<pm::Plane>_>::operator->
                   ((unique_ptr<pm::Plane,_std::default_delete<pm::Plane>_> *)local_28);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::get(&local_48);
  pm::Geometry::setMaterial(&this->super_Geometry,&pPVar3->super_Material);
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Plane,std::default_delete<pm::Plane>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)local_60,
             (unique_ptr<pm::Plane,_std::default_delete<pm::Plane>_> *)local_28);
  pm::World::addObject(world,local_60);
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr(local_60);
  std::unique_ptr<pm::Material,std::default_delete<pm::Material>>::
  unique_ptr<pm::Phong,std::default_delete<pm::Phong>,void>
            ((unique_ptr<pm::Material,std::default_delete<pm::Material>> *)&sphere1,&local_48);
  pm::World::addMaterial
            (world,(unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&sphere1);
  std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::~unique_ptr
            ((unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&sphere1);
  pm::Vector3::Vector3
            ((Vector3 *)
             ((long)&red._M_t.super___uniq_ptr_impl<pm::Phong,_std::default_delete<pm::Phong>_>._M_t
                     .super__Tuple_impl<0UL,_pm::Phong_*,_std::default_delete<pm::Phong>_>.
                     super__Head_base<0UL,_pm::Phong_*,_false>._M_head_impl + 4),0.0,1.0,0.0);
  red._M_t.super___uniq_ptr_impl<pm::Phong,_std::default_delete<pm::Phong>_>._M_t.
  super__Tuple_impl<0UL,_pm::Phong_*,_std::default_delete<pm::Phong>_>.
  super__Head_base<0UL,_pm::Phong_*,_false>._M_head_impl._0_4_ = 0x3f800000;
  std::make_unique<pm::Sphere,pm::Vector3,float>
            ((Vector3 *)local_70,
             (float *)((long)&red._M_t.
                              super___uniq_ptr_impl<pm::Phong,_std::default_delete<pm::Phong>_>._M_t
                              .super__Tuple_impl<0UL,_pm::Phong_*,_std::default_delete<pm::Phong>_>.
                              super__Head_base<0UL,_pm::Phong_*,_false>._M_head_impl + 4));
  std::make_unique<pm::Phong>();
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_88);
  pm::Phong::setCd(pPVar3,1.0,0.0,0.0);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_88);
  pm::Phong::setKa(pPVar3,0.25);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_88);
  pm::Phong::setKd(pPVar3,0.65);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_88);
  pm::Phong::setKs(pPVar3,0.15);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_88);
  pm::Phong::setSpecularExp(pPVar3,32.0);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_88);
  pLVar4 = pm::Phong::ambient(pPVar3);
  pm::BRDF::setSampler
            (&pLVar4->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_88);
  pLVar4 = pm::Phong::diffuse(pPVar3);
  pm::BRDF::setSampler
            (&pLVar4->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_88);
  pGVar5 = pm::Phong::specular(pPVar3);
  pm::BRDF::setSampler
            (&pGVar5->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  pSVar6 = std::unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_>::operator->
                     ((unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_> *)local_70);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::get(&local_88);
  pm::Geometry::setMaterial(&pSVar6->super_Geometry,&pPVar3->super_Material);
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Sphere,std::default_delete<pm::Sphere>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&local_90,
             (unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_> *)local_70);
  pm::World::addObject(world,&local_90);
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr(&local_90);
  std::unique_ptr<pm::Material,std::default_delete<pm::Material>>::
  unique_ptr<pm::Phong,std::default_delete<pm::Phong>,void>
            ((unique_ptr<pm::Material,std::default_delete<pm::Material>> *)&sphere2,&local_88);
  pm::World::addMaterial
            (world,(unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&sphere2);
  std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::~unique_ptr
            ((unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&sphere2);
  pm::Vector3::Vector3
            ((Vector3 *)
             ((long)&green._M_t.super___uniq_ptr_impl<pm::Phong,_std::default_delete<pm::Phong>_>.
                     _M_t.super__Tuple_impl<0UL,_pm::Phong_*,_std::default_delete<pm::Phong>_>.
                     super__Head_base<0UL,_pm::Phong_*,_false>._M_head_impl + 4),2.0,0.5,0.0);
  green._M_t.super___uniq_ptr_impl<pm::Phong,_std::default_delete<pm::Phong>_>._M_t.
  super__Tuple_impl<0UL,_pm::Phong_*,_std::default_delete<pm::Phong>_>.
  super__Head_base<0UL,_pm::Phong_*,_false>._M_head_impl._0_4_ = 0x3f000000;
  std::make_unique<pm::Sphere,pm::Vector3,float>
            ((Vector3 *)local_a0,
             (float *)((long)&green._M_t.
                              super___uniq_ptr_impl<pm::Phong,_std::default_delete<pm::Phong>_>._M_t
                              .super__Tuple_impl<0UL,_pm::Phong_*,_std::default_delete<pm::Phong>_>.
                              super__Head_base<0UL,_pm::Phong_*,_false>._M_head_impl + 4));
  std::make_unique<pm::Phong>();
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_b8);
  pm::Phong::setCd(pPVar3,0.0,1.0,0.0);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_b8);
  pm::Phong::setKa(pPVar3,0.1);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_b8);
  pm::Phong::setKd(pPVar3,0.45);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_b8);
  pm::Phong::setKs(pPVar3,0.5);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_b8);
  pm::Phong::setSpecularExp(pPVar3,32.0);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_b8);
  pLVar4 = pm::Phong::ambient(pPVar3);
  pm::BRDF::setSampler
            (&pLVar4->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_b8);
  pLVar4 = pm::Phong::diffuse(pPVar3);
  pm::BRDF::setSampler
            (&pLVar4->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_b8);
  pGVar5 = pm::Phong::specular(pPVar3);
  pm::BRDF::setSampler
            (&pGVar5->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  pSVar6 = std::unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_>::operator->
                     ((unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_> *)local_a0);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::get(&local_b8);
  pm::Geometry::setMaterial(&pSVar6->super_Geometry,&pPVar3->super_Material);
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Sphere,std::default_delete<pm::Sphere>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&local_c0,
             (unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_> *)local_a0);
  pm::World::addObject(world,&local_c0);
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr(&local_c0);
  std::unique_ptr<pm::Material,std::default_delete<pm::Material>>::
  unique_ptr<pm::Phong,std::default_delete<pm::Phong>,void>
            ((unique_ptr<pm::Material,std::default_delete<pm::Material>> *)&sphere3,&local_b8);
  pm::World::addMaterial
            (world,(unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&sphere3);
  std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::~unique_ptr
            ((unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&sphere3);
  pm::Vector3::Vector3
            ((Vector3 *)
             ((long)&blue._M_t.super___uniq_ptr_impl<pm::Phong,_std::default_delete<pm::Phong>_>.
                     _M_t.super__Tuple_impl<0UL,_pm::Phong_*,_std::default_delete<pm::Phong>_>.
                     super__Head_base<0UL,_pm::Phong_*,_false>._M_head_impl + 4),-2.0,2.0,0.0);
  blue._M_t.super___uniq_ptr_impl<pm::Phong,_std::default_delete<pm::Phong>_>._M_t.
  super__Tuple_impl<0UL,_pm::Phong_*,_std::default_delete<pm::Phong>_>.
  super__Head_base<0UL,_pm::Phong_*,_false>._M_head_impl._0_4_ = 0x3f400000;
  std::make_unique<pm::Sphere,pm::Vector3,float>
            ((Vector3 *)local_d0,
             (float *)((long)&blue._M_t.
                              super___uniq_ptr_impl<pm::Phong,_std::default_delete<pm::Phong>_>._M_t
                              .super__Tuple_impl<0UL,_pm::Phong_*,_std::default_delete<pm::Phong>_>.
                              super__Head_base<0UL,_pm::Phong_*,_false>._M_head_impl + 4));
  std::make_unique<pm::Phong>();
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_e8);
  pm::Phong::setCd(pPVar3,0.0,0.0,1.0);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_e8);
  pm::Phong::setKa(pPVar3,0.1);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_e8);
  pm::Phong::setKd(pPVar3,0.75);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_e8);
  pm::Phong::setKs(pPVar3,0.25);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_e8);
  pm::Phong::setSpecularExp(pPVar3,24.0);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_e8);
  pLVar4 = pm::Phong::ambient(pPVar3);
  pm::BRDF::setSampler
            (&pLVar4->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_e8);
  pLVar4 = pm::Phong::diffuse(pPVar3);
  pm::BRDF::setSampler
            (&pLVar4->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::operator->(&local_e8);
  pGVar5 = pm::Phong::specular(pPVar3);
  pm::BRDF::setSampler
            (&pGVar5->super_BRDF,
             (Sampler *)
             plane._M_t.super___uniq_ptr_impl<pm::Plane,_std::default_delete<pm::Plane>_>._M_t.
             super__Tuple_impl<0UL,_pm::Plane_*,_std::default_delete<pm::Plane>_>.
             super__Head_base<0UL,_pm::Plane_*,_false>._M_head_impl);
  pSVar6 = std::unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_>::operator->
                     ((unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_> *)local_d0);
  pPVar3 = std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::get(&local_e8);
  pm::Geometry::setMaterial(&pSVar6->super_Geometry,&pPVar3->super_Material);
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Sphere,std::default_delete<pm::Sphere>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&local_f0,
             (unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_> *)local_d0);
  pm::World::addObject(world,&local_f0);
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr(&local_f0);
  std::unique_ptr<pm::Material,std::default_delete<pm::Material>>::
  unique_ptr<pm::Phong,std::default_delete<pm::Phong>,void>
            ((unique_ptr<pm::Material,std::default_delete<pm::Material>> *)&local_f8,&local_e8);
  pm::World::addMaterial(world,&local_f8);
  std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::~unique_ptr(&local_f8);
  std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::~unique_ptr(&local_e8);
  std::unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_>::~unique_ptr
            ((unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_> *)local_d0);
  std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::~unique_ptr(&local_b8);
  std::unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_>::~unique_ptr
            ((unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_> *)local_a0);
  std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::~unique_ptr(&local_88);
  std::unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_>::~unique_ptr
            ((unique_ptr<pm::Sphere,_std::default_delete<pm::Sphere>_> *)local_70);
  std::unique_ptr<pm::Phong,_std::default_delete<pm::Phong>_>::~unique_ptr(&local_48);
  std::unique_ptr<pm::Plane,_std::default_delete<pm::Plane>_>::~unique_ptr
            ((unique_ptr<pm::Plane,_std::default_delete<pm::Plane>_> *)local_28);
  return;
}

Assistant:

void setupWorld(pm::World &world)
{
	auto vpSampler = world.createSampler<pm::NRooks>(NumSamples);

	world.viewPlane().setDimensions(Width, Height);
	world.viewPlane().setSampler(vpSampler);
	world.viewPlane().editMaxDepth() = 5;

	auto hammersley = world.createSampler<pm::Hammersley>(NumSamples);

#if AMBIENT
	auto ambient = std::make_unique<pm::Ambient>();
	ambient->setRadianceScale(0.01f);
	world.setAmbientLight(std::move(ambient));
#elif AMBIENT_OCCLUSION
	auto multiJittered = world.createSampler<pm::MultiJittered>(64);
	auto ambient = std::make_unique<pm::AmbientOccluder>();
	ambient->setRadianceScale(0.01f);
	ambient->setColor(0.25f, 0.25f, 0.25f);
	ambient->setMinAmount(0.0f);
	ambient->setSampler(multiJittered);
	world.setAmbientLight(std::move(ambient));
#endif

	auto plane = std::make_unique<pm::Plane>(pm::Vector3(0.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 1.0f, 0.0f));
	auto white = std::make_unique<pm::Phong>();
	white->setCd(1.0f, 1.0f, 1.0f);
	white->setKa(0.25f);
	white->setKd(0.45f);
	//white->setKs(0.25f);
	//white->setSpecularExp(32.0f);
	white->ambient().setSampler(hammersley);
	white->diffuse().setSampler(hammersley);
	white->specular().setSampler(hammersley);
	plane->setMaterial(white.get());
	world.addObject(std::move(plane));
	world.addMaterial(std::move(white));

	auto sphere1 = std::make_unique<pm::Sphere>(pm::Vector3(0.0f, 1.0f, 0.0f), 1.0f);
	auto red = std::make_unique<pm::Phong>();
	red->setCd(1.0f, 0.0f, 0.0f);
	red->setKa(0.25f);
	red->setKd(0.65f);
	red->setKs(0.15f);
	red->setSpecularExp(32.0f);
	red->ambient().setSampler(hammersley);
	red->diffuse().setSampler(hammersley);
	red->specular().setSampler(hammersley);
	sphere1->setMaterial(red.get());
	world.addObject(std::move(sphere1));
	world.addMaterial(std::move(red));

	auto sphere2 = std::make_unique<pm::Sphere>(pm::Vector3(2.0f, 0.5f, 0.0f), 0.5f);
	auto green = std::make_unique<pm::Phong>();
	green->setCd(0.0f, 1.0f, 0.0f);
	green->setKa(0.1f);
	green->setKd(0.45f);
	green->setKs(0.5f);
	green->setSpecularExp(32.0f);
	green->ambient().setSampler(hammersley);
	green->diffuse().setSampler(hammersley);
	green->specular().setSampler(hammersley);
	sphere2->setMaterial(green.get());
	world.addObject(std::move(sphere2));
	world.addMaterial(std::move(green));

	auto sphere3 = std::make_unique<pm::Sphere>(pm::Vector3(-2.0f, 2.0f, 0.0f), 0.75f);
	auto blue = std::make_unique<pm::Phong>();
	blue->setCd(0.0f, 0.0f, 1.0f);
	blue->setKa(0.1f);
	blue->setKd(0.75f);
	blue->setKs(0.25f);
	blue->setSpecularExp(24.0f);
	blue->ambient().setSampler(hammersley);
	blue->diffuse().setSampler(hammersley);
	blue->specular().setSampler(hammersley);
	sphere3->setMaterial(blue.get());
	world.addObject(std::move(sphere3));
	world.addMaterial(std::move(blue));

#if POINT_LIGHTS
	auto light1 = std::make_unique<pm::PointLight>(0.0f, 2.0f, -2.0f);
	//light1->setColor(1.0f, 0.0f, 1.0f);
	light1->setRadianceScale(0.1f);
	world.addLight(std::move(light1));

	auto light2 = std::make_unique<pm::PointLight>(3.0f, 3.0f, -2.0f);
	light2->setRadianceScale(0.1f);
	//light2->setCastShadows(false);
	//world.addLight(std::move(light2));

	auto light3 = std::make_unique<pm::PointLight>(-3.0f, 3.0f, -2.0);
	light3->setRadianceScale(0.1f);
	//light3->setColor(0.5f, 1.0f, 0.33f);
	//light3->setCastShadows(false);
	//world.addLight(std::move(light3));

	auto light4 = std::make_unique<pm::Directional>(-1.0f, 1.0f, 0.0f);
	light4->setRadianceScale(0.0001f);
	light4->setColor(0.5f, 1.0f, 0.33f);
	//light4->setCastShadows(false);
	//world.addLight(std::move(light4));
#elif AREA_LIGHTS
	auto emissive = world.createMaterial<pm::Emissive>();
	emissive->setRadianceScale(0.25f);

	auto object = world.createObject<pm::Rectangle>(pm::Vector3(-1.0f, 3.0f, -1.0f), pm::Vector3(2.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 2.0f), pm::Vector3(0.0f, -1.0f, 0.0f));
	object->setSampler(hammersley);
	object->setMaterial(emissive);
	object->setCastShadows(false);
	auto light1 = world.createLight<pm::AreaLight>(object);

	auto object2 = world.createObject<pm::Rectangle>(pm::Vector3(-4.0f, 0.0f, 0.5f), pm::Vector3(0.0f, 1.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 1.0f), pm::Vector3(1.0f, 0.0f, 0.0f));
	object2->setSampler(hammersley);
	object2->setMaterial(emissive);
	object2->setCastShadows(false);
	auto light2 = world.createLight<pm::AreaLight>(object2);

	auto envSampler = world.createSampler<pm::NRooks>(256);
	auto envEmissive = world.createMaterial<pm::Emissive>();
	envEmissive->setRadianceScale(0.1f);
	envEmissive->setCe(1.0f, 1.0f, 0.6f);
	auto envlight = world.createLight<pm::EnvironmentLight>(envEmissive);
	envlight->setSampler(envSampler);
#elif PATH_TRACE
	auto object = std::make_unique<pm::Rectangle>(pm::Vector3(-1.0f, 3.0f, -1.0f), pm::Vector3(2.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 2.0f), pm::Vector3(0.0f, -1.0f, 0.0f));
	object->setSampler(hammersley);
	auto emissive = std::make_unique<pm::Emissive>();
	emissive->setRadianceScale(0.25f);
	//emissive->setCe(1.0f, 0.0f, 0.0f);
	object->setMaterial(emissive.get());
	world.addObject(std::move(object));
	world.addMaterial(std::move(emissive));

	auto object2 = std::make_unique<pm::Rectangle>(pm::Vector3(-4.0f, 0.0f, 0.5f), pm::Vector3(0.0f, 1.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 1.0f), pm::Vector3(1.0f, 0.0f, 0.0f));
	object2->setSampler(hammersley);
	auto emissive2 = std::make_unique<pm::Emissive>();
	emissive2->setRadianceScale(0.2f);
	//emissive2->setCe(1.0f, 0.0f, 0.0f);
	object2->setMaterial(emissive2.get());
	world.addObject(std::move(object2));
	world.addMaterial(std::move(emissive2));
#endif
}